

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O3

void __thiscall
cmVirtualDirectoryWatcher::~cmVirtualDirectoryWatcher(cmVirtualDirectoryWatcher *this)

{
  (this->super_cmIBaseWatcher)._vptr_cmIBaseWatcher =
       (_func_int **)&PTR__cmVirtualDirectoryWatcher_005cb118;
  std::
  for_each<std::__detail::_Node_const_iterator<std::pair<std::__cxx11::string_const,cmIBaseWatcher*>,false,true>,ContainerAlgorithms::DefaultDeleter<std::unordered_map<std::__cxx11::string,cmIBaseWatcher*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmIBaseWatcher*>>>,true>>
            ((this->Children)._M_h._M_before_begin._M_nxt,0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->Children)._M_h);
  return;
}

Assistant:

~cmVirtualDirectoryWatcher() override { cmDeleteAll(this->Children); }